

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Segment::MakeNewCluster(Segment *this,uint64_t frame_timestamp_ns)

{
  int iVar1;
  uint uVar2;
  Cluster **ppCVar3;
  bool bVar4;
  Cluster **ppCVar5;
  ulong uVar6;
  int64_t cues_pos;
  Cluster *this_00;
  ulong uVar7;
  ulong uVar8;
  
  iVar1 = this->cluster_list_capacity_;
  uVar2 = this->cluster_list_size_;
  if (iVar1 <= (int)uVar2) {
    uVar8 = 1;
    if (0 < iVar1) {
      uVar8 = (ulong)(uint)(iVar1 * 2);
    }
    ppCVar5 = (Cluster **)operator_new__(uVar8 * 8,(nothrow_t *)&std::nothrow);
    uVar6 = 0;
    if (ppCVar5 == (Cluster **)0x0) goto LAB_00120e7d;
    ppCVar3 = this->cluster_list_;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      ppCVar5[uVar6] = ppCVar3[uVar6];
    }
    if (ppCVar3 != (Cluster **)0x0) {
      operator_delete__(ppCVar3);
    }
    this->cluster_list_ = ppCVar5;
    this->cluster_list_capacity_ = (int32_t)uVar8;
  }
  bVar4 = WriteFramesLessThan(this,frame_timestamp_ns);
  if (bVar4) {
    if ((long)this->cluster_list_size_ < 1) {
LAB_00120d54:
      if (this->output_cues_ == true) {
        this->new_cuepoint_ = true;
      }
      if ((this->chunking_ == true) && (0 < this->cluster_list_size_)) {
        MkvWriter::Close(this->chunk_writer_cluster_);
        this->chunk_count_ = this->chunk_count_ + 1;
        bVar4 = UpdateChunkName(this,"chk",&this->chunk_name_);
        if (bVar4) {
          bVar4 = MkvWriter::Open(this->chunk_writer_cluster_,this->chunk_name_);
          if (bVar4) goto LAB_00120dc1;
        }
      }
      else {
LAB_00120dc1:
        uVar8 = (this->segment_info_).timecode_scale_;
        uVar6 = frame_timestamp_ns / uVar8;
        if ((0 < this->frames_size_) &&
           (uVar8 = (*this->frames_)->timestamp_ / uVar8, uVar8 < uVar6)) {
          uVar6 = uVar8;
        }
        ppCVar5 = this->cluster_list_;
        iVar1 = this->cluster_list_size_;
        cues_pos = MaxOffset(this);
        this_00 = (Cluster *)operator_new(0xa0,(nothrow_t *)&std::nothrow);
        if (this_00 == (Cluster *)0x0) {
          ppCVar5[iVar1] = (Cluster *)0x0;
        }
        else {
          Cluster::Cluster(this_00,uVar6,cues_pos,(this->segment_info_).timecode_scale_,
                           this->accurate_cluster_duration_,this->fixed_size_cluster_timecode_);
          ppCVar5[iVar1] = this_00;
          if (this->writer_cluster_ != (IMkvWriter *)0x0) {
            this_00->writer_ = this->writer_cluster_;
            this->cluster_list_size_ = uVar2 + 1;
            uVar6 = 1;
            goto LAB_00120e7d;
          }
        }
      }
    }
    else if (this->cluster_list_[(long)this->cluster_list_size_ + -1] != (Cluster *)0x0) {
      bVar4 = Cluster::Finalize(this->cluster_list_[(long)this->cluster_list_size_ + -1],true,
                                frame_timestamp_ns);
      if (bVar4) goto LAB_00120d54;
    }
  }
  uVar6 = 0;
LAB_00120e7d:
  return SUB81(uVar6,0);
}

Assistant:

bool Segment::MakeNewCluster(uint64_t frame_timestamp_ns) {
  const int32_t new_size = cluster_list_size_ + 1;

  if (new_size > cluster_list_capacity_) {
    // Add more clusters.
    const int32_t new_capacity =
        (cluster_list_capacity_ <= 0) ? 1 : cluster_list_capacity_ * 2;
    Cluster** const clusters =
        new (std::nothrow) Cluster*[new_capacity];  // NOLINT
    if (!clusters)
      return false;

    for (int32_t i = 0; i < cluster_list_size_; ++i) {
      clusters[i] = cluster_list_[i];
    }

    delete[] cluster_list_;

    cluster_list_ = clusters;
    cluster_list_capacity_ = new_capacity;
  }

  if (!WriteFramesLessThan(frame_timestamp_ns))
    return false;

  if (cluster_list_size_ > 0) {
    // Update old cluster's size
    Cluster* const old_cluster = cluster_list_[cluster_list_size_ - 1];

    if (!old_cluster || !old_cluster->Finalize(true, frame_timestamp_ns))
      return false;
  }

  if (output_cues_)
    new_cuepoint_ = true;

  if (chunking_ && cluster_list_size_ > 0) {
    chunk_writer_cluster_->Close();
    chunk_count_++;

    if (!UpdateChunkName("chk", &chunk_name_))
      return false;
    if (!chunk_writer_cluster_->Open(chunk_name_))
      return false;
  }

  const uint64_t timecode_scale = segment_info_.timecode_scale();
  const uint64_t frame_timecode = frame_timestamp_ns / timecode_scale;

  uint64_t cluster_timecode = frame_timecode;

  if (frames_size_ > 0) {
    const Frame* const f = frames_[0];  // earliest queued frame
    const uint64_t ns = f->timestamp();
    const uint64_t tc = ns / timecode_scale;

    if (tc < cluster_timecode)
      cluster_timecode = tc;
  }

  Cluster*& cluster = cluster_list_[cluster_list_size_];
  const int64_t offset = MaxOffset();
  cluster = new (std::nothrow)
      Cluster(cluster_timecode, offset, segment_info_.timecode_scale(),
              accurate_cluster_duration_, fixed_size_cluster_timecode_);
  if (!cluster)
    return false;

  if (!cluster->Init(writer_cluster_))
    return false;

  cluster_list_size_ = new_size;
  return true;
}